

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

float __thiscall deqp::gls::anon_unknown_1::GLValue::toFloat(GLValue *this)

{
  uint uVar1;
  float fVar2;
  
  switch(this->type) {
  case INPUTTYPE_FLOAT:
    return (this->field_1).fl.m_value;
  case INPUTTYPE_FIXED:
    return (float)(*(int *)&this->field_1 * 2 + 1) / 65535.0;
  case INPUTTYPE_DOUBLE:
    return (float)(double)this->field_1;
  case INPUTTYPE_BYTE:
    uVar1 = (uint)(this->field_1).b.m_value;
    break;
  case INPUTTYPE_SHORT:
    uVar1 = (uint)(this->field_1).s.m_value;
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    uVar1 = (uint)(byte)(this->field_1).b.m_value;
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    uVar1 = (uint)(ushort)(this->field_1).s.m_value;
    break;
  case INPUTTYPE_INT:
    return (float)*(int *)&this->field_1;
  case INPUTTYPE_UNSIGNED_INT:
    return (float)(uint)(this->field_1).fl.m_value;
  case INPUTTYPE_HALF:
    fVar2 = Half::to<float>(&(this->field_1).h);
    return fVar2;
  default:
    return 0.0;
  }
  return (float)(int)uVar1;
}

Assistant:

float GLValue::toFloat (void) const
{
	switch (type)
	{
		case DrawTestSpec::INPUTTYPE_FLOAT:
			return fl.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_BYTE:
			return b.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE:
			return ub.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_SHORT:
			return s.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT:
			return us.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_FIXED:
		{
			int maxValue = 65536;
			return (float)(double(2 * fi.getValue() + 1) / (maxValue - 1));

			break;
		}

		case DrawTestSpec::INPUTTYPE_UNSIGNED_INT:
			return (float)ui.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_INT:
			return (float)i.getValue();
			break;

		case DrawTestSpec::INPUTTYPE_HALF:
			return h.to<float>();
			break;

		case DrawTestSpec::INPUTTYPE_DOUBLE:
			return d.to<float>();
			break;

		default:
			DE_ASSERT(false);
			return 0.0f;
			break;
	};
}